

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_iterator.h
# Opt level: O2

node_iterator_base<const_YAML::detail::node> * __thiscall
YAML::detail::node_iterator_base<const_YAML::detail::node>::operator++
          (node_iterator_base<const_YAML::detail::node> *this)

{
  MapIter MVar1;
  
  if (this->m_type == Map) {
    MVar1._M_current = (this->m_mapIt)._M_current + 1;
    (this->m_mapIt)._M_current = MVar1._M_current;
    MVar1 = increment_until_defined(this,MVar1);
    (this->m_mapIt)._M_current = MVar1._M_current;
  }
  else if (this->m_type == Sequence) {
    (this->m_seqIt)._M_current = (this->m_seqIt)._M_current + 1;
  }
  return this;
}

Assistant:

node_iterator_base<V>& operator++() {
    switch (m_type) {
      case iterator_type::NoneType:
        break;
      case iterator_type::Sequence:
        ++m_seqIt;
        break;
      case iterator_type::Map:
        ++m_mapIt;
        m_mapIt = increment_until_defined(m_mapIt);
        break;
    }
    return *this;
  }